

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

bool HelpRequested(ArgsManager *args)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  allocator<char> local_a4;
  allocator<char> local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"-?",&local_a1);
  bVar1 = ArgsManager::IsArgSet(args,&local_40);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"-h",&local_a2);
    bVar1 = ArgsManager::IsArgSet(args,&local_60);
    bVar2 = true;
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"-help",&local_a3);
      bVar1 = ArgsManager::IsArgSet(args,&local_80);
      bVar2 = true;
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"-help-debug",&local_a4);
        bVar2 = ArgsManager::IsArgSet(args,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool HelpRequested(const ArgsManager& args)
{
    return args.IsArgSet("-?") || args.IsArgSet("-h") || args.IsArgSet("-help") || args.IsArgSet("-help-debug");
}